

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relationship.h
# Opt level: O3

void __thiscall DIS::IsPartOfPdu::setRelationship(IsPartOfPdu *this,Relationship *pX)

{
  unsigned_short uVar1;
  
  uVar1 = pX->_position;
  (this->_relationship)._nature = pX->_nature;
  (this->_relationship)._position = uVar1;
  return;
}

Assistant:

class OPENDIS7_EXPORT Relationship
{
protected:
  /** the nature or purpose for joining of the part entity to the host entity and shall be represented by a 16-bit enumeration */
  unsigned short _nature; 

  /** the position of the part entity with respect to the host entity and shall be represented by a 16-bit enumeration */
  unsigned short _position; 


 public:
    Relationship();
    virtual ~Relationship();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getNature() const; 
    void setNature(unsigned short pX); 

    unsigned short getPosition() const; 
    void setPosition(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Relationship& rhs) const;
}